

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O3

void __thiscall
AnyDistributionEdgeCalculator::AnyDistributionEdgeCalculator
          (AnyDistributionEdgeCalculator *this,double significance_level,
          HistogramBasedDistribution *ild)

{
  pointer pdVar1;
  pointer pdVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  insert_size_sum_dist;
  undefined1 local_20 [8];
  vector<double,_std::allocator<double>_> *local_18;
  
  (this->super_EdgeCalculator)._vptr_EdgeCalculator =
       (_func_int **)&PTR__AnyDistributionEdgeCalculator_001b80d8;
  this->significance_level = significance_level;
  HistogramBasedDistribution::toDistribution
            ((HistogramBasedDistribution *)local_20,0.0001,(int *)ild);
  this->insert_size_dist = (vector<double,_std::allocator<double>_> *)local_20;
  pdVar1 = (((_Vector_base<double,_std::allocator<double>_> *)local_20)->_M_impl).
           super__Vector_impl_data._M_start;
  pdVar2 = (((_Vector_base<double,_std::allocator<double>_> *)local_20)->_M_impl).
           super__Vector_impl_data._M_finish;
  lVar4 = (long)pdVar2 - (long)pdVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    dVar6 = 0.0;
    lVar5 = 0;
    do {
      dVar6 = dVar6 + pdVar1[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    if (pdVar2 != pdVar1) {
      lVar5 = 0;
      do {
        pdVar1[lVar5] = pdVar1[lVar5] / dVar6;
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
  }
  iVar3 = computeAllowableInsertSizeDiff(this);
  this->allowable_insert_size_diff = iVar3;
  Distributions::convolve
            ((Distributions *)local_20,this->insert_size_dist,this->insert_size_dist,
             this->insert_size_dist_offset,this->insert_size_dist_offset,
             &this->insert_size_sum_ccdf_offset);
  Distributions::toCCDF
            ((Distributions *)&local_18,(vector<double,_std::allocator<double>_> *)local_20);
  this->insert_size_sum_ccdf = local_18;
  if (local_20 != (undefined1  [8])0x0) {
    pdVar1 = (((_Vector_base<double,_std::allocator<double>_> *)local_20)->_M_impl).
             super__Vector_impl_data._M_start;
    if (pdVar1 != (pointer)0x0) {
      operator_delete(pdVar1);
    }
    operator_delete((void *)local_20);
  }
  return;
}

Assistant:

AnyDistributionEdgeCalculator::AnyDistributionEdgeCalculator(double significance_level, const HistogramBasedDistribution& ild) : significance_level(significance_level) {
	this->insert_size_dist = ild.toDistribution(1e-4, &insert_size_dist_offset).release();
// 	cerr << "Using internal segment size distribution: " << endl;
// 	for (int i=0; i < (int)insert_size_dist->size(); ++i) {
// 		cerr << (i+insert_size_dist_offset) << " " << insert_size_dist->at(i) << endl;
// 	}
	// since we truncated the tails (a bit), we renormalize back to one
	double sum = 0.0;
	for (size_t i=0; i < insert_size_dist->size(); ++i) sum += insert_size_dist->at(i);
	for (size_t i=0; i < insert_size_dist->size(); ++i) insert_size_dist->at(i) /= sum;
	allowable_insert_size_diff = computeAllowableInsertSizeDiff();
	// cout << "allowable insert size difference: " << allowable_insert_size_diff << endl;
	unique_ptr<vector<double> > insert_size_sum_dist = Distributions::convolve(*insert_size_dist, *insert_size_dist, insert_size_dist_offset, insert_size_dist_offset, &insert_size_sum_ccdf_offset);
	this->insert_size_sum_ccdf = Distributions::toCCDF(*insert_size_sum_dist).release();
}